

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O3

int __thiscall Fl_Tree_Item::depth(Fl_Tree_Item *this)

{
  int iVar1;
  
  iVar1 = -1;
  do {
    this = this->_parent;
    iVar1 = iVar1 + 1;
  } while (this != (Fl_Tree_Item *)0x0);
  return iVar1;
}

Assistant:

int Fl_Tree_Item::depth() const {
  int count = 0;
  const Fl_Tree_Item *item = parent();
  while ( item ) {
    ++count;
    item = item->parent();
  }
  return(count);
}